

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O3

void Fl::delete_widget(Fl_Widget *wi)

{
  Fl_Widget **ppFVar1;
  int iVar2;
  long *plVar3;
  Fl_Widget **__dest;
  long lVar4;
  int iVar5;
  ulong uVar6;
  undefined4 extraout_var;
  
  if (wi != (Fl_Widget *)0x0) {
    iVar2 = Fl_Widget::visible_r(wi);
    if (iVar2 != 0) {
      (*wi->_vptr_Fl_Widget[6])(wi);
    }
    iVar2 = (*wi->_vptr_Fl_Widget[8])(wi);
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    if ((plVar3 != (long *)0x0) && (plVar3[0x14] != 0)) {
      (**(code **)(*plVar3 + 0x30))(plVar3);
    }
    iVar5 = alloc_dwidgets;
    iVar2 = num_dwidgets;
    if (0 < (long)num_dwidgets) {
      lVar4 = 0;
      do {
        if (dwidgets[lVar4] == wi) {
          return;
        }
        lVar4 = lVar4 + 1;
      } while (num_dwidgets != lVar4);
    }
    if (alloc_dwidgets <= num_dwidgets) {
      lVar4 = (long)alloc_dwidgets;
      uVar6 = 0xffffffffffffffff;
      if (-0xb < alloc_dwidgets) {
        uVar6 = lVar4 * 8 + 0x50;
      }
      __dest = (Fl_Widget **)operator_new__(uVar6);
      ppFVar1 = dwidgets;
      if (iVar5 == 0) {
        iVar5 = 0;
      }
      else {
        memcpy(__dest,dwidgets,lVar4 << 3);
        if (ppFVar1 != (Fl_Widget **)0x0) {
          operator_delete__(ppFVar1);
          iVar5 = alloc_dwidgets;
          iVar2 = num_dwidgets;
        }
      }
      num_dwidgets = iVar2;
      alloc_dwidgets = iVar5 + 10;
      dwidgets = __dest;
    }
    dwidgets[num_dwidgets] = wi;
    num_dwidgets = num_dwidgets + 1;
  }
  return;
}

Assistant:

void Fl::delete_widget(Fl_Widget *wi) {
  if (!wi) return;

  // if the widget is shown(), hide() it (FLTK 1.3.4)
  if (wi->visible_r()) wi->hide();
  Fl_Window *win = wi->as_window();
  if (win && win->shown()) win->hide(); // case of iconified window

  // don't add the same widget twice to the widget delete list
  for (int i = 0; i < num_dwidgets; i++) {
    if (dwidgets[i]==wi) return;
  }

  if (num_dwidgets >= alloc_dwidgets) {
    Fl_Widget	**temp;

    temp = new Fl_Widget *[alloc_dwidgets + 10];
    if (alloc_dwidgets) {
      memcpy(temp, dwidgets, alloc_dwidgets * sizeof(Fl_Widget *));
      delete[] dwidgets;
    }

    dwidgets = temp;
    alloc_dwidgets += 10;
  }

  dwidgets[num_dwidgets] = wi;
  num_dwidgets ++;
}